

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

char * __thiscall MemIStream::readMemoryMapped(MemIStream *this,int n)

{
  long lVar1;
  size_type sVar2;
  runtime_error *this_00;
  char *pcVar3;
  int in_ESI;
  long in_RDI;
  uint64_t oldStreamptr;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)(*(long *)(in_RDI + 0x30) + 0x30));
  if (sVar2 < (ulong)(in_ESI + lVar1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"attempt to read past end of file");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar1 = *(long *)(in_RDI + 0x28);
  *(long *)(in_RDI + 0x28) = (long)in_ESI + *(long *)(in_RDI + 0x28);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x11abdc);
  return pcVar3 + lVar1;
}

Assistant:

char* readMemoryMapped (int n) override
    {
        if (n + streamptr > ostream.data.size ())
        {
            throw runtime_error ("attempt to read past end of file");
        }
        uint64_t oldStreamptr = streamptr;
        streamptr += n;
        return const_cast<char*> (ostream.data.data () + oldStreamptr);
    }